

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
* __thiscall
Board::get_endangered_pieces
          (map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
           *__return_storage_ptr__,Board *this,play *single_play)

{
  short sVar1;
  pointer ppVar2;
  element_type *peVar3;
  pointer ppVar4;
  long lVar5;
  __shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_> *move;
  pointer ppVar7;
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  endangered_pieces;
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar2 = (single_play->
           super__Vector_base<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppVar7 = (single_play->
                super__Vector_base<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1) {
    peVar3 = (ppVar7->second).super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      ppVar4 = (peVar3->m_positions).
               super__Vector_base<std::pair<unsigned_int,_Point>,_std::allocator<std::pair<unsigned_int,_Point>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar1 = ppVar4[-1].second.m_y;
      lVar5 = *(long *)&(this->m_board).m_data.
                        super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[ppVar4[-1].second.m_x].
                        super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
      ;
      p_Var6 = &std::
                map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                              *)&local_60,&ppVar4[-1].second)->
                super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var6,(__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
                        (lVar5 + (long)sVar1 * 0x10));
    }
    ppVar4 = *(pointer *)
              ((long)&(((ppVar7->first).super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->m_positions).
                      super__Vector_base<std::pair<unsigned_int,_Point>,_std::allocator<std::pair<unsigned_int,_Point>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    sVar1 = ppVar4[-1].second.m_y;
    lVar5 = *(long *)&(this->m_board).m_data.
                      super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[ppVar4[-1].second.m_x].
                      super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
    ;
    p_Var6 = &std::
              map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
              ::operator[]((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                            *)&local_60,&ppVar4[-1].second)->
              super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var6,(__shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2> *)
                      (lVar5 + (long)sVar1 * 0x10));
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,
             &local_60._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<Point,_std::pair<const_Point,_std::shared_ptr<Piece>_>,_std::_Select1st<std::pair<const_Point,_std::shared_ptr<Piece>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

map<Point, shared_ptr<Piece>> Board::get_endangered_pieces(const play &single_play) const {
    map<Point, shared_ptr<Piece>> endangered_pieces;
    for (const auto &move : single_play) {
        if (move.second != nullptr) {
            endangered_pieces[move.second->get_position()] = m_board[move.second->get_position()];
        }
        endangered_pieces[move.first->get_position()] = m_board[move.first->get_position()];
    }
    return move(endangered_pieces);
}